

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::MultiSelectItemFooter(ImGuiID id,bool *p_selected,bool *p_pressed)

{
  ImRect *r;
  ImS8 IVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiMultiSelectTempData *ms;
  ImGuiMultiSelectState *pIVar3;
  ImGuiSelectionUserData first_item;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ImGuiBoxSelectState *pIVar8;
  int iVar9;
  ImGuiSelectionUserData first_item_00;
  char cVar10;
  byte bVar11;
  uint uVar12;
  ImGuiInputSource IVar13;
  byte selected;
  bool bVar14;
  byte bVar15;
  char local_5c;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  selected = *p_selected;
  bVar6 = *p_pressed;
  ms = GImGui->CurrentMultiSelect;
  if (bVar6 == true) {
    ms->IsFocused = true;
  }
  pIVar3 = ms->Storage;
  if (((pIVar4->LastItemData).StatusFlags & 1) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = IsItemHovered(0x20);
  }
  if ((bVar5 == false) && (ms->IsFocused == false)) {
    return;
  }
  if (pIVar4->NavId == id) {
    bVar14 = pIVar3->RangeSrcItem == -1;
  }
  else {
    bVar14 = false;
  }
  uVar12 = ms->KeyMods;
  first_item = (pIVar4->NextItemData).SelectionUserData;
  uVar2 = ms->Flags;
  if (ms->IsEndIO == false) {
    ImVector<ImGuiSelectionRequest>::resize((ImVector<ImGuiSelectionRequest> *)ms,0);
    ms->IsEndIO = true;
  }
  cVar10 = bVar6;
  if (pIVar4->NavJustMovedToId == id) {
    if ((uVar2 & 8) == 0) {
      cVar10 = '\x01';
      if (((uVar12 & 0x3000) != 0x3000) && (cVar10 = bVar6, (uVar12 & 0x1000) == 0)) {
        cVar10 = '\x01';
        selected = 1;
      }
    }
    else {
      cVar10 = '\x01';
      if ((uVar12 & 0x2000) == 0) {
        cVar10 = bVar6;
      }
      bVar14 = (bool)((uVar12 & 0x3000) == 0 | bVar14);
    }
  }
  if (bVar14) {
    pIVar3->RangeSrcItem = first_item;
    pIVar3->RangeSelected = selected;
  }
  if ((ms->BoxSelectId != 0) &&
     (pIVar8 = GetBoxSelectState(ms->BoxSelectId), pIVar8 != (ImGuiBoxSelectState *)0x0)) {
    r = &(pIVar4->LastItemData).Rect;
    bVar6 = ImRect::Overlaps(&pIVar8->BoxSelectRectCurr,r);
    bVar14 = ImRect::Overlaps(&pIVar8->BoxSelectRectPrev,r);
    bVar11 = selected;
    if (!bVar6 || bVar14) {
      bVar11 = bVar6 || !bVar14;
    }
    if (bVar11 == 0) {
      iVar7 = pIVar3->LastSelectionSize;
      if ((iVar7 < 1) && (pIVar8->IsStartedSetNavIdOnce == true)) {
        pIVar8->IsStartedSetNavIdOnce = false;
        cVar10 = '\x01';
      }
      else {
        selected = selected ^ 1;
        MultiSelectAddSetRange(ms,(bool)selected,1,first_item,first_item);
        iVar7 = pIVar3->LastSelectionSize;
      }
      iVar9 = 0;
      if (0 < iVar7) {
        iVar9 = iVar7;
      }
      pIVar3->LastSelectionSize = iVar9 + 1;
    }
  }
  if (((bVar5 == false) || (bVar6 = IsMouseClicked(1,false), !bVar6)) || ((uVar2 & 8) != 0)) {
LAB_0018d50b:
    if (cVar10 != '\0') {
      bVar11 = (byte)((uVar12 & 0x1000) >> 0xc);
      local_5c = (char)((uVar12 & 0x2000) >> 0xd);
      goto LAB_0018d522;
    }
  }
  else {
    if (pIVar4->ActiveId != id && pIVar4->ActiveId != 0) {
      ClearActiveID();
    }
    SetFocusID(id,window);
    if ((cVar10 != '\0') || (selected != 0)) goto LAB_0018d50b;
    cVar10 = '\x01';
    bVar11 = 0;
    local_5c = '\0';
LAB_0018d522:
    IVar13 = ImGuiInputSource_Mouse;
    if (pIVar4->NavActivateId == id) {
      if (((pIVar4->NavActivateFlags & 1) != 0) && (selected != 0)) goto LAB_0018d6cd;
      if (pIVar4->NavJustMovedToId == id || pIVar4->NavActivateId == id) goto LAB_0018d559;
    }
    else if (pIVar4->NavJustMovedToId == id) {
LAB_0018d559:
      IVar13 = pIVar4->NavInputSource;
    }
    if (((((uVar2 & 0xc0) != 0) && (selected == 0)) && ((pIVar4->BoxSelectState).IsActive == false))
       && ((IVar13 == ImGuiInputSource_Mouse && (pIVar4->BoxSelectState).IsStarting == false &&
           ((pIVar4->IO).MouseClickedCount[0] == 1)))) {
      BoxSelectPreStartDrag(ms->BoxSelectId,first_item);
    }
    if ((uVar2 & 0x10) == 0) {
      if ((uVar2 & 1) == 0) {
        if (((IVar13 == ImGuiInputSource_Mouse) || (bVar15 = bVar11, pIVar4->NavActivateId == id))
           && (bVar15 = 1, bVar11 == 0)) {
          bVar15 = selected;
          if ((uVar2 & 0x20) == 0) goto LAB_0018d61c;
        }
        else if (((IVar13 & ~ImGuiInputSource_Mouse) != ImGuiInputSource_Keyboard) ||
                (local_5c == '\0')) goto LAB_0018d62f;
        if (bVar15 != 0) goto LAB_0018d62f;
      }
LAB_0018d61c:
      MultiSelectAddSetAll(ms,false);
    }
LAB_0018d62f:
    if ((local_5c == '\0') || ((uVar2 & 1) != 0)) {
      uVar12 = 1;
      bVar15 = 1;
      if (bVar11 != 0) {
        bVar15 = selected ^ 1;
      }
      if ((uVar2 & 8) != 0) {
        bVar15 = selected ^ 1;
      }
      pIVar3->RangeSrcItem = first_item;
      first_item_00 = first_item;
      selected = bVar15;
    }
    else {
      first_item_00 = pIVar3->RangeSrcItem;
      if (pIVar3->RangeSrcItem == -1) {
        pIVar3->RangeSrcItem = first_item;
        first_item_00 = first_item;
      }
      if ((uVar2 & 8) == 0) {
        bVar15 = 1;
        if ((bVar11 != 0) && (IVar1 = pIVar3->RangeSelected, IVar1 != -1)) {
LAB_0018d6a4:
          bVar15 = IVar1 != '\0';
        }
      }
      else {
        if (ms->IsKeyboardSetRange == true) {
          IVar1 = pIVar3->RangeSelected;
          goto LAB_0018d6a4;
        }
        bVar15 = selected ^ 1;
      }
      uVar12 = ms->RangeSrcPassedBy - 1 | 1;
    }
    MultiSelectAddSetRange(ms,(bool)bVar15,uVar12,first_item_00,first_item);
  }
LAB_0018d6cd:
  if (pIVar3->RangeSrcItem == first_item) {
    pIVar3->RangeSelected = selected;
  }
  if (pIVar4->NavId == id) {
    pIVar3->NavIdItem = first_item;
    pIVar3->NavIdSelected = selected;
  }
  else if (pIVar3->NavIdItem != first_item) goto LAB_0018d6f5;
  ms->NavIdPassedBy = true;
LAB_0018d6f5:
  ms->LastSubmittedItem = first_item;
  *p_selected = (bool)selected;
  *p_pressed = (bool)cVar10;
  return;
}

Assistant:

void ImGui::MultiSelectItemFooter(ImGuiID id, bool* p_selected, bool* p_pressed)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool selected = *p_selected;
    bool pressed = *p_pressed;
    ImGuiMultiSelectTempData* ms = g.CurrentMultiSelect;
    ImGuiMultiSelectState* storage = ms->Storage;
    if (pressed)
        ms->IsFocused = true;

    bool hovered = false;
    if (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect)
        hovered = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (!ms->IsFocused && !hovered)
        return;

    ImGuiSelectionUserData item_data = g.NextItemData.SelectionUserData;

    ImGuiMultiSelectFlags flags = ms->Flags;
    const bool is_singleselect = (flags & ImGuiMultiSelectFlags_SingleSelect) != 0;
    bool is_ctrl = (ms->KeyMods & ImGuiMod_Ctrl) != 0;
    bool is_shift = (ms->KeyMods & ImGuiMod_Shift) != 0;

    bool apply_to_range_src = false;

    if (g.NavId == id && storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
        apply_to_range_src = true;
    if (ms->IsEndIO == false)
    {
        ms->IO.Requests.resize(0);
        ms->IsEndIO = true;
    }

    // Auto-select as you navigate a list
    if (g.NavJustMovedToId == id)
    {
        if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
        {
            if (is_ctrl && is_shift)
                pressed = true;
            else if (!is_ctrl)
                selected = pressed = true;
        }
        else
        {
            // With NoAutoSelect, using Shift+keyboard performs a write/copy
            if (is_shift)
                pressed = true;
            else if (!is_ctrl)
                apply_to_range_src = true; // Since if (pressed) {} main block is not running we update this
        }
    }

    if (apply_to_range_src)
    {
        storage->RangeSrcItem = item_data;
        storage->RangeSelected = selected; // Will be updated at the end of this function anyway.
    }

    // Box-select toggle handling
    if (ms->BoxSelectId != 0)
        if (ImGuiBoxSelectState* bs = GetBoxSelectState(ms->BoxSelectId))
        {
            const bool rect_overlap_curr = bs->BoxSelectRectCurr.Overlaps(g.LastItemData.Rect);
            const bool rect_overlap_prev = bs->BoxSelectRectPrev.Overlaps(g.LastItemData.Rect);
            if ((rect_overlap_curr && !rect_overlap_prev && !selected) || (rect_overlap_prev && !rect_overlap_curr))
            {
                if (storage->LastSelectionSize <= 0 && bs->IsStartedSetNavIdOnce)
                {
                    pressed = true; // First item act as a pressed: code below will emit selection request and set NavId (whatever we emit here will be overridden anyway)
                    bs->IsStartedSetNavIdOnce = false;
                }
                else
                {
                    selected = !selected;
                    MultiSelectAddSetRange(ms, selected, +1, item_data, item_data);
                }
                storage->LastSelectionSize = ImMax(storage->LastSelectionSize + 1, 1);
            }
        }

    // Right-click handling.
    // FIXME-MULTISELECT: Currently filtered out by ImGuiMultiSelectFlags_NoAutoSelect but maybe should be moved to Selectable(). See https://github.com/ocornut/imgui/pull/5816
    if (hovered && IsMouseClicked(1) && (flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
    {
        if (g.ActiveId != 0 && g.ActiveId != id)
            ClearActiveID();
        SetFocusID(id, window);
        if (!pressed && !selected)
        {
            pressed = true;
            is_ctrl = is_shift = false;
        }
    }

    // Unlike Space, Enter doesn't alter selection (but can still return a press) unless current item is not selected.
    // The later, "unless current item is not select", may become optional? It seems like a better default if Enter doesn't necessarily open something
    // (unlike e.g. Windows explorer). For use case where Enter always open something, we might decide to make this optional?
    const bool enter_pressed = pressed && (g.NavActivateId == id) && (g.NavActivateFlags & ImGuiActivateFlags_PreferInput);

    // Alter selection
    if (pressed && (!enter_pressed || !selected))
    {
        // Box-select
        ImGuiInputSource input_source = (g.NavJustMovedToId == id || g.NavActivateId == id) ? g.NavInputSource : ImGuiInputSource_Mouse;
        if (flags & (ImGuiMultiSelectFlags_BoxSelect1d | ImGuiMultiSelectFlags_BoxSelect2d))
            if (selected == false && !g.BoxSelectState.IsActive && !g.BoxSelectState.IsStarting && input_source == ImGuiInputSource_Mouse && g.IO.MouseClickedCount[0] == 1)
                BoxSelectPreStartDrag(ms->BoxSelectId, item_data);

        //----------------------------------------------------------------------------------------
        // ACTION                      | Begin  | Pressed/Activated  | End
        //----------------------------------------------------------------------------------------
        // Keys Navigated:             | Clear  | Src=item, Sel=1               SetRange 1
        // Keys Navigated: Ctrl        | n/a    | n/a
        // Keys Navigated:      Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Keys Navigated: Ctrl+Shift  | n/a    | Dst=item, Sel=Src  => Clear + SetRange Src-Dst
        // Keys Activated:             | n/a    | Src=item, Sel=1    => Clear + SetRange 1
        // Keys Activated: Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetSange 1
        // Keys Activated:      Shift  | n/a    | Dst=item, Sel=1    => Clear + SetSange 1
        //----------------------------------------------------------------------------------------
        // Mouse Pressed:              | n/a    | Src=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetRange 1
        // Mouse Pressed:       Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl+Shift  | n/a    | Dst=item, Sel=!Sel =>         SetRange Src-Dst
        //----------------------------------------------------------------------------------------

        if ((flags & ImGuiMultiSelectFlags_NoAutoClear) == 0)
        {
            bool request_clear = false;
            if (is_singleselect)
                request_clear = true;
            else if ((input_source == ImGuiInputSource_Mouse || g.NavActivateId == id) && !is_ctrl)
                request_clear = (flags & ImGuiMultiSelectFlags_NoAutoClearOnReselect) ? !selected : true;
            else if ((input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Gamepad) && is_shift && !is_ctrl)
                request_clear = true; // With is_shift==false the RequestClear was done in BeginIO, not necessary to do again.
            if (request_clear)
                MultiSelectAddSetAll(ms, false);
        }

        int range_direction;
        bool range_selected;
        if (is_shift && !is_singleselect)
        {
            //IM_ASSERT(storage->HasRangeSrc && storage->HasRangeValue);
            if (storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
                storage->RangeSrcItem = item_data;
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
            {
                // Shift+Arrow always select
                // Ctrl+Shift+Arrow copy source selection state (already stored by BeginMultiSelect() in storage->RangeSelected)
                range_selected = (is_ctrl && storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
            }
            else
            {
                // Shift+Arrow copy source selection state
                // Shift+Click always copy from target selection state
                if (ms->IsKeyboardSetRange)
                    range_selected = (storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
                else
                    range_selected = !selected;
            }
            range_direction = ms->RangeSrcPassedBy ? +1 : -1;
        }
        else
        {
            // Ctrl inverts selection, otherwise always select
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
                selected = is_ctrl ? !selected : true;
            else
                selected = !selected;
            storage->RangeSrcItem = item_data;
            range_selected = selected;
            range_direction = +1;
        }
        MultiSelectAddSetRange(ms, range_selected, range_direction, storage->RangeSrcItem, item_data);
    }

    // Update/store the selection state of the Source item (used by CTRL+SHIFT, when Source is unselected we perform a range unselect)
    if (storage->RangeSrcItem == item_data)
        storage->RangeSelected = selected ? 1 : 0;

    // Update/store the selection state of focused item
    if (g.NavId == id)
    {
        storage->NavIdItem = item_data;
        storage->NavIdSelected = selected ? 1 : 0;
    }
    if (storage->NavIdItem == item_data)
        ms->NavIdPassedBy = true;
    ms->LastSubmittedItem = item_data;

    *p_selected = selected;
    *p_pressed = pressed;
}